

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O1

vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
* __thiscall
cmGlobalUnixMakefileGenerator3::GenerateBuildCommand
          (vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
           *__return_storage_ptr__,cmGlobalUnixMakefileGenerator3 *this,string *makeProgram,
          string *param_2,string *param_3,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targetNames,string *param_5,bool fast,int jobs,bool verbose,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makeOptions)

{
  tuple<cmMakefile_*,_std::default_delete<cmMakefile>_> tVar1;
  pointer ppcVar2;
  cmake *pcVar3;
  PositionType PVar4;
  pointer pbVar5;
  pointer pcVar6;
  uint __val;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar7;
  _Head_base<0UL,_cmMakefile_*,_false> this_00;
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  *pvVar8;
  uint uVar9;
  cmMakefile *this_01;
  string *psVar10;
  cmState *this_02;
  uint uVar11;
  ulong uVar12;
  uint __len;
  pointer pbVar13;
  pointer __p;
  bool bVar14;
  initializer_list<cmGlobalGenerator::GeneratedMakeCommand> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tname;
  string __str;
  _Head_base<0UL,_cmMakefile_*,_false> local_f0;
  cmStateSnapshot local_e8;
  char cStack_d0;
  string local_c0;
  undefined1 local_a0 [40];
  cmMakefile *local_78;
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  *local_70;
  string local_68;
  cmStateSnapshot local_48;
  
  local_f0._M_head_impl = (cmMakefile *)0x0;
  ppcVar2 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
            super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_70 = __return_storage_ptr__;
  if (ppcVar2 ==
      (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
      super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar3 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
    PVar4 = (pcVar3->CurrentSnapshot).Position.Position;
    local_e8.Position.Position._0_1_ = (undefined1)PVar4;
    local_e8.Position.Position._1_7_ = (undefined7)(PVar4 >> 8);
    local_e8.State = (pcVar3->CurrentSnapshot).State;
    pcVar7 = (pcVar3->CurrentSnapshot).Position.Tree;
    local_e8.Position.Tree._0_1_ = SUB81(pcVar7,0);
    local_e8.Position.Tree._1_7_ = (undefined7)((ulong)pcVar7 >> 8);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_a0,&local_e8);
    psVar10 = cmake::GetHomeDirectory_abi_cxx11_
                        ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance
                        );
    cmStateDirectory::SetCurrentSource((cmStateDirectory *)local_a0,psVar10);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_a0,&local_e8);
    psVar10 = cmake::GetHomeOutputDirectory_abi_cxx11_
                        ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance
                        );
    cmStateDirectory::SetCurrentBinary((cmStateDirectory *)local_a0,psVar10);
    cmStateSnapshot::SetDefaultDefinitions(&local_e8);
    this_01 = (cmMakefile *)operator_new(0x7e8);
    cmMakefile::cmMakefile(this_01,(cmGlobalGenerator *)this,&local_e8);
    this_00._M_head_impl = local_f0._M_head_impl;
    local_a0._0_8_ = (__uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>)0x0;
    bVar14 = local_f0._M_head_impl != (cmMakefile *)0x0;
    local_f0._M_head_impl = this_01;
    if (bVar14) {
      cmMakefile::~cmMakefile(this_00._M_head_impl);
      operator_delete(this_00._M_head_impl,0x7e8);
    }
    std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr
              ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)local_a0);
    local_78 = local_f0._M_head_impl;
  }
  else {
    local_78 = *ppcVar2;
  }
  local_e8.Position.Position._0_1_ = 0;
  local_e8.Position.Position._1_7_ = 0;
  cStack_d0 = '\0';
  local_e8.State = (cmState *)0x0;
  local_e8.Position.Tree._0_1_ = 0;
  local_e8.Position.Tree._1_7_ = 0;
  if (verbose) {
    psVar10 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,
               psVar10);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,
               (char (*) [3])"-E");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[4]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,
               (char (*) [4])"env");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[10]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,
               (char (*) [10])"VERBOSE=1");
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
  cmGlobalGenerator::SelectMakeProgram
            ((string *)local_a0,(cmGlobalGenerator *)this,makeProgram,&local_c0);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  tVar1.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
  super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>)((long)local_a0 + 0x10);
  if ((_Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>)local_a0._0_8_ !=
      (_Head_base<0UL,_cmMakefile_*,_false>)
      tVar1.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
      super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl) {
    operator_delete((void *)local_a0._0_8_,(ulong)(local_a0._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (jobs != -1) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,
               (char (*) [3])"-j");
    if (jobs != 0) {
      __val = -jobs;
      if (0 < jobs) {
        __val = jobs;
      }
      __len = 1;
      if (9 < __val) {
        uVar12 = (ulong)__val;
        uVar9 = 4;
        do {
          __len = uVar9;
          uVar11 = (uint)uVar12;
          if (uVar11 < 100) {
            __len = __len - 2;
            goto LAB_00336c09;
          }
          if (uVar11 < 1000) {
            __len = __len - 1;
            goto LAB_00336c09;
          }
          if (uVar11 < 10000) goto LAB_00336c09;
          uVar12 = uVar12 / 10000;
          uVar9 = __len + 4;
        } while (99999 < uVar11);
        __len = __len + 1;
      }
LAB_00336c09:
      local_a0._0_8_ =
           tVar1.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
      std::__cxx11::string::_M_construct((ulong)local_a0,(char)__len - (char)(jobs >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)(local_a0._0_8_ + (ulong)((uint)jobs >> 0x1f)),__len,__val);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      if ((_Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>)local_a0._0_8_ !=
          (_Head_base<0UL,_cmMakefile_*,_false>)
          tVar1.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
          super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl) {
        operator_delete((void *)local_a0._0_8_,(ulong)(local_a0._16_8_ + 1));
      }
    }
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,
             CONCAT71(local_e8.Position.Tree._1_7_,local_e8.Position.Tree._0_1_),
             (makeOptions->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (makeOptions->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  pbVar13 = (targetNames->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (targetNames->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar13 != pbVar5) {
    do {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      pcVar6 = (pbVar13->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,pcVar6,pcVar6 + pbVar13->_M_string_length);
      if (local_c0._M_string_length != 0) {
        if (fast) {
          std::__cxx11::string::append((char *)&local_c0);
        }
        cmMakefile::GetStateSnapshot(local_78);
        cmStateSnapshot::GetDirectory((cmStateDirectory *)local_a0,&local_48);
        this_02 = cmMakefile::GetState(local_78);
        psVar10 = cmState::GetBinaryDirectory_abi_cxx11_(this_02);
        cmStateDirectory::ConvertToRelPathIfNotContained
                  (&local_68,(cmStateDirectory *)local_a0,psVar10,&local_c0);
        std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        cmSystemTools::ConvertToOutputSlashes(&local_c0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,
                   &local_c0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      pbVar13 = pbVar13 + 1;
    } while (pbVar13 != pbVar5);
  }
  pvVar8 = local_70;
  local_a0._0_8_ = local_e8.State;
  local_a0._8_8_ = CONCAT71(local_e8.Position.Tree._1_7_,local_e8.Position.Tree._0_1_);
  local_a0._16_8_ =
       CONCAT71(local_e8.Position.Position._1_7_,(undefined1)local_e8.Position.Position);
  local_e8.State = (cmState *)0x0;
  local_e8.Position.Tree._0_1_ = 0;
  local_e8.Position.Tree._1_7_ = 0;
  local_e8.Position.Position._0_1_ = 0;
  local_e8.Position.Position._1_7_ = 0;
  local_a0[0x18] = cStack_d0;
  __l._M_len = 1;
  __l._M_array = (iterator)local_a0;
  std::
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  ::vector(local_70,__l,(allocator_type *)&local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_e8);
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr
            ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)&local_f0);
  return pvVar8;
}

Assistant:

std::vector<cmGlobalGenerator::GeneratedMakeCommand>
cmGlobalUnixMakefileGenerator3::GenerateBuildCommand(
  const std::string& makeProgram, const std::string& /*projectName*/,
  const std::string& /*projectDir*/,
  std::vector<std::string> const& targetNames, const std::string& /*config*/,
  bool fast, int jobs, bool verbose,
  std::vector<std::string> const& makeOptions)
{
  std::unique_ptr<cmMakefile> mfu;
  cmMakefile* mf;
  if (!this->Makefiles.empty()) {
    mf = this->Makefiles[0];
  } else {
    cmStateSnapshot snapshot = this->CMakeInstance->GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentSource(
      this->CMakeInstance->GetHomeDirectory());
    snapshot.GetDirectory().SetCurrentBinary(
      this->CMakeInstance->GetHomeOutputDirectory());
    snapshot.SetDefaultDefinitions();
    mfu = cm::make_unique<cmMakefile>(this, snapshot);
    mf = mfu.get();
  }

  GeneratedMakeCommand makeCommand;

  // Make it possible to set verbosity also from command line
  if (verbose) {
    makeCommand.Add(cmSystemTools::GetCMakeCommand());
    makeCommand.Add("-E");
    makeCommand.Add("env");
    makeCommand.Add("VERBOSE=1");
  }
  makeCommand.Add(this->SelectMakeProgram(makeProgram));

  if (jobs != cmake::NO_BUILD_PARALLEL_LEVEL) {
    makeCommand.Add("-j");
    if (jobs != cmake::DEFAULT_BUILD_PARALLEL_LEVEL) {
      makeCommand.Add(std::to_string(jobs));
    }
  }

  makeCommand.Add(makeOptions.begin(), makeOptions.end());
  for (auto tname : targetNames) {
    if (!tname.empty()) {
      if (fast) {
        tname += "/fast";
      }
      tname =
        mf->GetStateSnapshot().GetDirectory().ConvertToRelPathIfNotContained(
          mf->GetState()->GetBinaryDirectory(), tname);
      cmSystemTools::ConvertToOutputSlashes(tname);
      makeCommand.Add(std::move(tname));
    }
  }
  return { std::move(makeCommand) };
}